

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[23],unsigned_int,char[35],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [23],uint *RestArgs,char (*RestArgs_1) [35],uint *RestArgs_2,
               char (*RestArgs_3) [13],uint *RestArgs_4,char (*RestArgs_5) [47],uint *RestArgs_6,
               char (*RestArgs_7) [3])

{
  char (*RestArgs_local_3) [13];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [35];
  uint *RestArgs_local;
  char (*FirstArg_local) [23];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[23]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[35],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}